

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall
CEPlanet::SetSemiMajorAxis_AU
          (CEPlanet *this,double semi_major_axis_au,double semi_major_axis_au_per_cent)

{
  long in_RDI;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  if (0.0 < in_XMM0_Qa) {
    *(double *)(in_RDI + 0xb8) = in_XMM0_Qa;
    *(undefined8 *)(in_RDI + 0xe8) = in_XMM1_Qa;
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "[ERROR] CEPlanet::SetSemiMajorAxis_AU() : Semi major axis must be positive!\n")
    ;
  }
  return;
}

Assistant:

void CEPlanet::SetSemiMajorAxis_AU(double semi_major_axis_au,
                                   double semi_major_axis_au_per_cent)
{
    // Make sure the semi_major_axis is positive
    if (semi_major_axis_au <= 0.0) {
        std::cerr << "[ERROR] CEPlanet::SetSemiMajorAxis_AU() : Semi major axis must be positive!\n";
    } else {
        semi_major_axis_au_ = semi_major_axis_au ;
        semi_major_axis_au_per_cent_ = semi_major_axis_au_per_cent ;
    }
}